

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeEncodingSynapse.cpp
# Opt level: O0

void __thiscall
BSA_SpikeEncodingSynapse::BSA_SpikeEncodingSynapse
          (BSA_SpikeEncodingSynapse *this,Population *n_from,Population *n_to)

{
  BSA_SpikeEncodingSynapse_param *this_00;
  Synapse *in_RDI;
  Population *in_stack_00000090;
  Population *in_stack_00000098;
  BSA_SpikeEncodingSynapse *in_stack_000000a0;
  
  Synapse::Synapse(in_RDI);
  in_RDI->_vptr_Synapse = (_func_int **)&PTR_update_00198d50;
  this_00 = (BSA_SpikeEncodingSynapse_param *)operator_new(0x20);
  BSA_SpikeEncodingSynapse_param::BSA_SpikeEncodingSynapse_param(this_00);
  in_RDI[1]._vptr_Synapse = (_func_int **)this_00;
  std::
  vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
            *)0x1781a5);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1781b8);
  std::
  vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
            *)0x1781cb);
  std::vector<Event_*,_std::allocator<Event_*>_>::vector
            ((vector<Event_*,_std::allocator<Event_*>_> *)0x1781de);
  initialize(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  return;
}

Assistant:

BSA_SpikeEncodingSynapse::BSA_SpikeEncodingSynapse(Population* n_from, Population* n_to) : 
    param(new BSA_SpikeEncodingSynapse_param)
{
    initialize(n_from, n_to);
}